

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tadsrsc.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  ushort **ppuVar5;
  byte *pbVar6;
  long in_RSI;
  int in_EDI;
  char *p_1;
  int l;
  osfildef *argfp;
  int do_create;
  opctxdef opctx;
  opdef *oplist;
  char buf [128];
  char *infile;
  char *p;
  char inbuf [4097];
  char tmpfile [4097];
  osfildef *fpout;
  osfildef *fpin;
  int curarg;
  undefined6 in_stack_ffffffffffffdee8;
  undefined1 in_stack_ffffffffffffdeee;
  undefined1 in_stack_ffffffffffffdeef;
  char *in_stack_ffffffffffffdef0;
  char *in_stack_ffffffffffffdef8;
  undefined4 in_stack_ffffffffffffdf00;
  undefined4 in_stack_ffffffffffffdf04;
  opdef *local_20e0;
  byte local_20d8 [128];
  char *local_2058;
  char *local_2050;
  char local_2048 [136];
  opdef *in_stack_ffffffffffffe040;
  osfildef *in_stack_ffffffffffffe048;
  osfildef *in_stack_ffffffffffffe050;
  opctxdef *in_stack_ffffffffffffef28;
  char *in_stack_ffffffffffffef30;
  opdef *in_stack_ffffffffffffef38;
  char local_1038 [4112];
  FILE *local_28;
  FILE *local_20;
  int local_14;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  bVar1 = false;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("TADS Resource Manager version 2.2.4\n");
  printf("Copyright (c) 1992, 1999 by Michael J. Roberts.  ");
  printf("All Rights Reserved.\n");
  if (local_8 < 2) {
    usage();
  }
  local_14 = 1;
  while ((local_14 < local_8 && (**(char **)(local_10 + (long)local_14 * 8) == '-'))) {
    iVar2 = stricmp(in_stack_ffffffffffffdef0,
                    (char *)CONCAT17(in_stack_ffffffffffffdeef,
                                     CONCAT16(in_stack_ffffffffffffdeee,in_stack_ffffffffffffdee8)))
    ;
    if (iVar2 == 0) {
      bVar1 = true;
    }
    else {
      printf("unrecognized file option \"%s\"",*(undefined8 *)(local_10 + (long)local_14 * 8));
      errexit(in_stack_ffffffffffffdef0,
              CONCAT17(in_stack_ffffffffffffdeef,
                       CONCAT16(in_stack_ffffffffffffdeee,in_stack_ffffffffffffdee8)));
    }
    local_14 = local_14 + 1;
  }
  local_2058 = *(char **)(local_10 + (long)local_14 * 8);
  local_14 = local_14 + 1;
  strcpy(local_2048,local_2058);
  os_defext((char *)CONCAT44(in_stack_ffffffffffffdf04,in_stack_ffffffffffffdf00),
            in_stack_ffffffffffffdef8);
  if (bVar1) {
    local_20 = (FILE *)0x0;
  }
  else {
    local_20 = fopen(local_2048,"rb");
    if (local_20 == (FILE *)0x0) {
      errexit(in_stack_ffffffffffffdef0,
              CONCAT17(in_stack_ffffffffffffdeef,
                       CONCAT16(in_stack_ffffffffffffdeee,in_stack_ffffffffffffdee8)));
    }
  }
  if ((local_14 == local_8) && (local_20 != (FILE *)0x0)) {
    rscproc(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,in_stack_ffffffffffffe040);
    fclose(local_20);
    os_term(0);
  }
  if (bVar1) {
    local_28 = fopen(local_2048,"wb");
    if (local_28 == (FILE *)0x0) {
      errexit(in_stack_ffffffffffffdef0,
              CONCAT17(in_stack_ffffffffffffdeef,
                       CONCAT16(in_stack_ffffffffffffdeee,in_stack_ffffffffffffdee8)));
    }
    printf("\nFile created.\n");
  }
  else {
    strcpy(local_1038,local_2048);
    in_stack_ffffffffffffdef0 = local_1038;
    sVar4 = strlen(local_1038);
    local_2050 = in_stack_ffffffffffffdef0 + sVar4;
    while( true ) {
      in_stack_ffffffffffffdeef = false;
      if (((local_1038 < local_2050) && (in_stack_ffffffffffffdeef = false, local_2050[-1] != ':'))
         && (in_stack_ffffffffffffdeef = false, local_2050[-1] != '\\')) {
        in_stack_ffffffffffffdeef = local_2050[-1] != '/';
      }
      if ((bool)in_stack_ffffffffffffdeef == false) break;
      local_2050 = local_2050 + -1;
    }
    strcpy(local_2050,"$TADSRSC.TMP");
    local_28 = fopen(local_1038,"wb");
    if (local_28 == (FILE *)0x0) {
      errexit(in_stack_ffffffffffffdef0,
              CONCAT17(in_stack_ffffffffffffdeef,
                       CONCAT16(in_stack_ffffffffffffdeee,in_stack_ffffffffffffdee8)));
    }
  }
  if ((local_14 < local_8) && (**(char **)(local_10 + (long)local_14 * 8) == '@')) {
    __stream = fopen((char *)(*(long *)(local_10 + (long)local_14 * 8) + 1),"r");
    if (__stream == (FILE *)0x0) {
      errexit(in_stack_ffffffffffffdef0,
              CONCAT17(in_stack_ffffffffffffdeef,
                       CONCAT16(in_stack_ffffffffffffdeee,in_stack_ffffffffffffdee8)));
    }
    while (pcVar3 = fgets((char *)local_20d8,0x80,__stream), pcVar3 != (char *)0x0) {
      sVar4 = strlen((char *)local_20d8);
      iVar2 = (int)sVar4;
      if ((iVar2 != 0) && (local_20d8[iVar2 + -1] == 10)) {
        local_20d8[iVar2 + -1] = 0;
      }
      pbVar6 = local_20d8;
      while( true ) {
        in_stack_ffffffffffffdeee = false;
        if (*pbVar6 < 0x80) {
          ppuVar5 = __ctype_b_loc();
          in_stack_ffffffffffffdeee = ((*ppuVar5)[(int)(uint)*pbVar6] & 0x2000) != 0;
        }
        if ((bool)in_stack_ffffffffffffdeee == false) break;
        pbVar6 = pbVar6 + 1;
      }
      if (*pbVar6 != 0) {
        addop(in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
      }
    }
    fclose(__stream);
  }
  else {
    for (; local_14 < local_8; local_14 = local_14 + 1) {
      addop(in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
    }
  }
  for (local_20e0 = rscproc(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
                            in_stack_ffffffffffffe040); local_20e0 != (opdef *)0x0;
      local_20e0 = local_20e0->opnxt) {
    if ((local_20e0->opflag & 4U) == 0) {
      printf("warning: resource \"%s\" not found\n",local_20e0->opres);
    }
  }
  if (local_20 != (FILE *)0x0) {
    fclose(local_20);
  }
  if (local_28 != (FILE *)0x0) {
    fclose(local_28);
  }
  if (!bVar1) {
    iVar2 = remove(local_2048);
    if (iVar2 != 0) {
      errexit(in_stack_ffffffffffffdef0,
              CONCAT17(in_stack_ffffffffffffdeef,
                       CONCAT16(in_stack_ffffffffffffdeee,in_stack_ffffffffffffdee8)));
    }
    iVar2 = rename(local_1038,local_2048);
    if (iVar2 != 0) {
      errexit(in_stack_ffffffffffffdef0,
              CONCAT17(in_stack_ffffffffffffdeef,
                       CONCAT16(in_stack_ffffffffffffdeee,in_stack_ffffffffffffdee8)));
    }
  }
  os_term(0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int       curarg;
    osfildef *fpin;
    osfildef *fpout;
    char      tmpfile[OSFNMAX + 1];
    char      inbuf[OSFNMAX + 1];
    char     *p;
    char     *infile;
    char      buf[128];
    opdef    *oplist = (opdef *)0;
    opctxdef  opctx;
    int       do_create = FALSE;

    /* print main banner */
    rscptf("TADS Resource Manager version 2.2.4\n");
    rscptf("Copyright (c) 1992, 1999 by Michael J. Roberts.  ");
    rscptf("All Rights Reserved.\n");
    if (argc < 2) usage();

    /* set default parsing options */
    opctx.restype = RESTYPE_DFLT;
    opctx.flag = OPFADD | OPFDEL;
    opctx.doing_type = FALSE;

    /* scan file options (these come before the filename) */
    for (curarg = 1 ; curarg < argc ; ++curarg)
    {
        /* check if it's an option - if not, stop looking */
        if (argv[curarg][0] != '-')
            break;
        
        /* check the option */
        if (!stricmp(argv[curarg], "-create"))
        {
            /* note that we want to create the file */
            do_create = TRUE;
        }
        else
        {
            rscptf("unrecognized file option \"%s\"", argv[curarg]);
            errexit("", 1);
        }
    }
    
    /* get the file name */
    infile = argv[curarg++];
    strcpy(inbuf, infile);
    os_defext(inbuf, "gam");

    /* open the file for reading, unless we're creating a new file */
    if (do_create)
    {
        /* creating - we have no input file */
        fpin = 0;
    }
    else if ((fpin = osfoprb(inbuf, OSFTGAME)) == 0)
    {
        /* 
         *   not creating, so the file must already exist - it doesn't, so
         *   issue an error and quit 
         */
        errexit("unable to open resource file", 1);
    }

    /* 
     *   if no operations are desired, and we're not creating a new file,
     *   just list the existing file's contents and quit 
     */
    if (curarg == argc && fpin != 0)
    {
        rscproc(fpin, (osfildef *)0, 0);
        osfcls(fpin);
        os_term(OSEXSUCC);
    }

    /*
     *   Create an output file.  If we're creating a new file, create the
     *   file named on the command line; otherwise, create a temporary
     *   file that we'll write to while working and then rename to the
     *   original input filename after we've finished with the original
     *   input file.  
     */
    if (do_create)
    {
        /* create the new file */
        if ((fpout = osfopwb(inbuf, OSFTGAME)) == 0)
            errexit("unable to create file", 1);

        /* report the creation */
        rscptf("\nFile created.\n");
    }
    else
    {
        /* generate a temporary filename */
        strcpy(tmpfile, inbuf);
        for (p = tmpfile + strlen(tmpfile) ; p > tmpfile &&
                 *(p-1) != ':' && *(p-1) != '\\' && *(p-1) != '/' ; --p);
        strcpy(p, "$TADSRSC.TMP");

        /* open the temporary file */
        if ((fpout = osfopwb(tmpfile, OSFTGAME)) == 0)
            errexit("unable to create temporary file", 1);
    }

    /* see if we need to read a response file */
    if (curarg < argc && argv[curarg][0] == '@')
    {
        osfildef *argfp;
        int       l;
        char     *p;
        
        if (!(argfp = osfoprt(argv[curarg]+1, OSFTTEXT)))
            errexit("unable to open response file", 1);
        
        for (;;)
        {
            if (!osfgets(buf, sizeof(buf), argfp)) break;
            l = strlen(buf);
            if (l && buf[l-1] == '\n') buf[--l] = '\0';
            for (p = buf ; t_isspace(*p) ; ++p);
            if (!*p) continue;
            oplist = addop(oplist, p, &opctx);
        }
        osfcls(argfp);
    }
    else
    {
        for ( ; curarg < argc ; ++curarg)
            oplist = addop(oplist, argv[curarg], &opctx);
    }

    /* process the resources */
    oplist = rscproc(fpin, fpout, oplist);

    /* make sure they all got processed */
    for ( ; oplist != 0 ; oplist = oplist->opnxt)
    {
        if (!(oplist->opflag & OPFDONE))
            rscptf("warning: resource \"%s\" not found\n", oplist->opres);
    }
    
    /* close files */
    if (fpin != 0)
        osfcls(fpin);
    if (fpout != 0)
        osfcls(fpout);
    
    /* 
     *   if we didn't create a new file, remove the original input file
     *   and rename the temp file to the original file name 
     */
    if (!do_create)
    {
        /* remove the original input file */
        if (remove(inbuf))
            errexit("error deleting input file", 1);

        /* rename the temp file to the output file */
        if (rename(tmpfile, inbuf))
            errexit("error renaming temporary file", 1);
    }

    /* success */
    os_term(OSEXSUCC);
    return OSEXSUCC;
}